

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_encoder.cc
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte *__s2;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  int iVar9;
  int32_t iVar10;
  long lVar11;
  ExpertEncoder *this;
  uint uVar12;
  int iVar13;
  ExpertEncoder *extraout_RDX;
  ExpertEncoder *extraout_RDX_00;
  ExpertEncoder *extraout_RDX_01;
  ExpertEncoder *extraout_RDX_02;
  ExpertEncoder *extraout_RDX_03;
  ExpertEncoder *encoder_00;
  _Head_base<0UL,_draco::Mesh_*,_false> mesh;
  char *pcVar14;
  int iVar15;
  bool bVar16;
  _Head_base<0UL,_draco::PointCloud_*,_false> this_00;
  Options options;
  char *end;
  Encoder encoder;
  int local_214;
  int iStack_210;
  int local_208;
  int local_200;
  uint local_1f8;
  bool local_1f4;
  bool bStack_1f3;
  string local_1f0;
  undefined1 local_1d0 [32];
  string local_1b0;
  undefined1 local_190 [16];
  undefined1 local_180 [24];
  _Head_base<0UL,_draco::Mesh_*,_false> local_168;
  _Rb_tree<int,_std::pair<const_int,_draco::Options>,_std::_Select1st<std::pair<const_int,_draco::Options>_>,_std::less<int>,_std::allocator<std::pair<const_int,_draco::Options>_>_>
  local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  undefined1 local_100 [16];
  _Base_ptr local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Head_base<0UL,_draco::PointCloud_*,_false> local_d8;
  Status local_58;
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  bVar2 = false;
  local_214 = 0xb;
  iStack_210 = 10;
  bVar3 = false;
  local_208 = 8;
  bVar4 = false;
  local_200 = 8;
  bVar5 = false;
  local_1f8 = 7;
  local_1f4 = false;
  bStack_1f3 = false;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1d0._0_8_ = local_1d0 + 0x10;
  local_1d0._8_8_ =
       (__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>)0x0;
  local_1d0[0x10] = 0;
  if (1 < argc) {
    iVar15 = 1;
LAB_0010f403:
    uVar7 = local_1d0._8_8_;
    sVar6 = local_1f0._M_string_length;
    __s2 = (byte *)argv[iVar15];
    bVar1 = *__s2;
    iVar9 = -(bVar1 - 0x2d);
    iVar13 = iVar9;
    if (bVar1 == 0x2d) {
      uVar12 = __s2[1] - 0x68;
      if (uVar12 == 0) {
        uVar12 = (uint)__s2[2];
      }
      if (uVar12 != 0) {
        uVar12 = __s2[1] - 0x3f;
        if (uVar12 == 0) {
          uVar12 = (uint)__s2[2];
        }
        iVar13 = -uVar12;
        goto LAB_0010f44b;
      }
LAB_0010f895:
      anon_unknown.dwarf_8230::Usage();
      iVar15 = 0;
      goto LAB_0010f92b;
    }
LAB_0010f44b:
    if (iVar13 == 0) goto LAB_0010f895;
    if (bVar1 == 0x2d) {
      uVar12 = __s2[1] - 0x69;
      if (uVar12 == 0) {
        uVar12 = (uint)__s2[2];
      }
      if ((uVar12 != 0) || (argc + -1 <= iVar15)) {
        uVar12 = __s2[1] - 0x6f;
        if (uVar12 == 0) {
          uVar12 = (uint)__s2[2];
        }
        iVar9 = -uVar12;
        goto LAB_0010f4b4;
      }
      pcVar14 = argv[(long)iVar15 + 1];
      strlen(pcVar14);
      std::__cxx11::string::_M_replace((ulong)&local_1f0,0,(char *)sVar6,(ulong)pcVar14);
    }
    else {
LAB_0010f4b4:
      bVar16 = iVar15 < argc + -1;
      if ((iVar9 == 0) && (bVar16)) {
        pcVar14 = argv[(long)iVar15 + 1];
        strlen(pcVar14);
        std::__cxx11::string::_M_replace((ulong)local_1d0,0,(char *)uVar7,(ulong)pcVar14);
        goto LAB_0010f7ba;
      }
      iVar13 = strcmp("-point_cloud",(char *)__s2);
      if (iVar13 == 0) {
        bVar2 = true;
        goto LAB_0010f7bd;
      }
      iVar13 = strcmp("-qp",(char *)__s2);
      if (iVar13 == 0 && bVar16) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_100,argv[(long)iVar15 + 1],(allocator<char> *)(local_1d0 + 0x20))
        ;
        lVar11 = strtol((char *)CONCAT44(local_100._4_4_,local_100._0_4_),(char **)local_190,10);
        local_214 = (int)lVar11;
        if ((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_) != &local_f0) {
          operator_delete((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_),
                          (ulong)((long)&local_f0->_M_color + 1));
        }
        if (local_214 < 0x1f) goto LAB_0010f7ba;
        pcVar14 = "Error: The maximum number of quantization bits for the position attribute is 30."
        ;
LAB_00110080:
        puts(pcVar14);
        iVar15 = -1;
        goto LAB_0010f92b;
      }
      iVar13 = strcmp("-qt",(char *)__s2);
      if (iVar13 == 0 && bVar16) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_100,argv[(long)iVar15 + 1],(allocator<char> *)(local_1d0 + 0x20))
        ;
        lVar11 = strtol((char *)CONCAT44(local_100._4_4_,local_100._0_4_),(char **)local_190,10);
        iStack_210 = (int)lVar11;
        if ((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_) != &local_f0) {
          operator_delete((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_),
                          (ulong)((long)&local_f0->_M_color + 1));
        }
        if (0x1e < iStack_210) {
          pcVar14 = 
          "Error: The maximum number of quantization bits for the texture coordinate attribute is 30."
          ;
          goto LAB_00110080;
        }
      }
      else {
        iVar13 = strcmp("-qn",(char *)__s2);
        if (iVar13 == 0 && bVar16) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_100,argv[(long)iVar15 + 1],
                     (allocator<char> *)(local_1d0 + 0x20));
          lVar11 = strtol((char *)CONCAT44(local_100._4_4_,local_100._0_4_),(char **)local_190,10);
          local_208 = (int)lVar11;
          if ((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_) != &local_f0) {
            operator_delete((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_),
                            (ulong)((long)&local_f0->_M_color + 1));
          }
          if (0x1e < local_208) {
            pcVar14 = 
            "Error: The maximum number of quantization bits for the normal attribute is 30.";
            goto LAB_00110080;
          }
        }
        else {
          iVar13 = strcmp("-qg",(char *)__s2);
          if (iVar13 == 0 && bVar16) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_100,argv[(long)iVar15 + 1],
                       (allocator<char> *)(local_1d0 + 0x20));
            lVar11 = strtol((char *)CONCAT44(local_100._4_4_,local_100._0_4_),(char **)local_190,10)
            ;
            local_200 = (int)lVar11;
            if ((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_) != &local_f0) {
              operator_delete((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_),
                              (ulong)((long)&local_f0->_M_color + 1));
            }
            if (0x1e < local_200) {
              pcVar14 = 
              "Error: The maximum number of quantization bits for generic attributes is 30.";
              goto LAB_00110080;
            }
          }
          else {
            iVar13 = strcmp("-cl",(char *)__s2);
            if (iVar13 != 0 || !bVar16) {
              iVar13 = strcmp("--skip",(char *)__s2);
              if (iVar13 == 0 && bVar16) {
                iVar9 = iVar15 + 1;
                pcVar14 = argv[(long)iVar15 + 1];
                iVar13 = strcmp("NORMAL",pcVar14);
                iVar15 = iVar9;
                if (iVar13 == 0) {
                  local_208 = -1;
                }
                else {
                  iVar13 = strcmp("TEX_COORD",pcVar14);
                  if (iVar13 == 0) {
                    iStack_210 = -1;
                  }
                  else {
                    iVar13 = strcmp("GENERIC",pcVar14);
                    if (iVar13 != 0) {
                      pcVar14 = "Error: Invalid attribute name after --skip";
                      goto LAB_00110080;
                    }
                    local_200 = -1;
                  }
                }
              }
              else {
                iVar13 = strcmp("--metadata",(char *)__s2);
                if (iVar13 == 0) {
                  bStack_1f3 = true;
                }
                else {
                  iVar13 = strcmp("-preserve_polygons",(char *)__s2);
                  if (iVar13 == 0) {
                    local_1f4 = true;
                  }
                }
              }
              goto LAB_0010f7bd;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_100,argv[(long)iVar15 + 1],
                       (allocator<char> *)(local_1d0 + 0x20));
            lVar11 = strtol((char *)CONCAT44(local_100._4_4_,local_100._0_4_),(char **)local_190,10)
            ;
            local_1f8 = (uint)lVar11;
            if ((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_) != &local_f0) {
              operator_delete((_Base_ptr *)CONCAT44(local_100._4_4_,local_100._0_4_),
                              (ulong)((long)&local_f0->_M_color + 1));
            }
          }
        }
      }
    }
LAB_0010f7ba:
    iVar15 = iVar15 + 1;
LAB_0010f7bd:
    iVar15 = iVar15 + 1;
    if (argc <= iVar15) goto LAB_0010f8a6;
    goto LAB_0010f403;
  }
  goto LAB_0010f921;
LAB_0010f8a6:
  if ((argc != 2) && ((char *)local_1f0._M_string_length != (char *)0x0)) {
    if (bVar2) {
      draco::ReadPointCloudFromFile
                ((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                  *)local_100,&local_1f0);
      if (local_100._0_4_ == OK) {
        iVar15 = 0;
        this_00._M_head_impl = local_d8._M_head_impl;
      }
      else {
        printf("Failed loading the input point cloud: %s.\n");
        iVar15 = -1;
        this_00._M_head_impl = &((Mesh *)0x0)->super_PointCloud;
        if ((__uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>)
            local_d8._M_head_impl !=
            (__uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>)0x0) {
          (**(code **)(*(long *)local_d8._M_head_impl + 8))();
          this_00._M_head_impl = &((Mesh *)0x0)->super_PointCloud;
        }
      }
      local_d8._M_head_impl = (PointCloud *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_100._12_4_,local_100._8_4_) != &local_e8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_100._12_4_,local_100._8_4_),
                        (ulong)(local_e8._M_allocated_capacity + 1));
      }
      mesh._M_head_impl = (Mesh *)this_00._M_head_impl;
      if (local_100._0_4_ == OK) {
        mesh._M_head_impl = (Mesh *)0x0;
LAB_0010fb3d:
        if (local_214 < 0) {
          puts("Error: Position attribute cannot be skipped.");
          iVar15 = -1;
          mesh._M_head_impl = (Mesh *)this_00._M_head_impl;
        }
        else {
          if (iStack_210 < 0) {
            iVar10 = draco::PointCloud::NumNamedAttributes(this_00._M_head_impl,TEX_COORD);
            if (0 < iVar10) {
              bVar3 = true;
            }
            while (iVar10 = draco::PointCloud::NumNamedAttributes(this_00._M_head_impl,TEX_COORD),
                  0 < iVar10) {
              uVar12 = draco::PointCloud::GetNamedAttributeId(this_00._M_head_impl,TEX_COORD,0);
              (*((PointCloud *)&(this_00._M_head_impl)->_vptr_PointCloud)->_vptr_PointCloud[3])
                        (this_00._M_head_impl,(ulong)uVar12);
            }
          }
          if (local_208 < 0) {
            iVar10 = draco::PointCloud::NumNamedAttributes(this_00._M_head_impl,NORMAL);
            if (0 < iVar10) {
              bVar4 = true;
            }
            while (iVar10 = draco::PointCloud::NumNamedAttributes(this_00._M_head_impl,NORMAL),
                  0 < iVar10) {
              uVar12 = draco::PointCloud::GetNamedAttributeId(this_00._M_head_impl,NORMAL,0);
              (*((PointCloud *)&(this_00._M_head_impl)->_vptr_PointCloud)->_vptr_PointCloud[3])
                        (this_00._M_head_impl,(ulong)uVar12);
            }
          }
          if (local_200 < 0) {
            iVar10 = draco::PointCloud::NumNamedAttributes(this_00._M_head_impl,GENERIC);
            if (0 < iVar10) {
              bVar5 = true;
            }
            while (iVar10 = draco::PointCloud::NumNamedAttributes(this_00._M_head_impl,GENERIC),
                  0 < iVar10) {
              uVar12 = draco::PointCloud::GetNamedAttributeId(this_00._M_head_impl,GENERIC,0);
              (*((PointCloud *)&(this_00._M_head_impl)->_vptr_PointCloud)->_vptr_PointCloud[3])
                        (this_00._M_head_impl,(ulong)uVar12);
            }
          }
          if (((bVar3) || (bVar4)) || (bVar5)) {
            (*((PointCloud *)&(this_00._M_head_impl)->_vptr_PointCloud)->_vptr_PointCloud[5])
                      (this_00._M_head_impl);
          }
          draco::Encoder::Encoder((Encoder *)local_100);
          if (0 < local_214) {
            draco::Encoder::SetAttributeQuantization((Encoder *)local_100,POSITION,local_214);
          }
          if (0 < iStack_210) {
            draco::Encoder::SetAttributeQuantization((Encoder *)local_100,TEX_COORD,iStack_210);
          }
          if (0 < local_208) {
            draco::Encoder::SetAttributeQuantization((Encoder *)local_100,NORMAL,local_208);
          }
          if (0 < local_200) {
            draco::Encoder::SetAttributeQuantization((Encoder *)local_100,GENERIC,local_200);
          }
          draco::Encoder::SetSpeedOptions((Encoder *)local_100,10 - local_1f8,10 - local_1f8);
          if ((GeometryMetadata *)local_1d0._8_8_ == (GeometryMetadata *)0x0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_190,&local_1f0,".drc");
            std::__cxx11::string::operator=((string *)local_1d0,(string *)local_190);
            if ((undefined1 *)local_190._0_8_ != local_180) {
              operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
            }
          }
          puts("Encoder options:");
          printf("  Compression level = %d\n",(ulong)local_1f8);
          if (local_214 == 0) {
            puts("  Positions: No quantization");
          }
          else {
            printf("  Positions: Quantization = %d bits\n");
          }
          iVar10 = draco::PointCloud::GetNamedAttributeId(this_00._M_head_impl,TEX_COORD);
          if (iVar10 < 0) {
            if (bVar3) {
              pcVar14 = "  Texture coordinates: Skipped";
              goto LAB_0010fdf5;
            }
          }
          else if (iStack_210 == 0) {
            pcVar14 = "  Texture coordinates: No quantization";
LAB_0010fdf5:
            puts(pcVar14);
          }
          else {
            printf("  Texture coordinates: Quantization = %d bits\n");
          }
          iVar10 = draco::PointCloud::GetNamedAttributeId(this_00._M_head_impl,NORMAL);
          if (iVar10 < 0) {
            if (bVar4) {
              pcVar14 = "  Normals: Skipped";
              goto LAB_0010fe3a;
            }
          }
          else if (local_208 == 0) {
            pcVar14 = "  Normals: No quantization";
LAB_0010fe3a:
            puts(pcVar14);
          }
          else {
            printf("  Normals: Quantization = %d bits\n");
          }
          iVar10 = draco::PointCloud::GetNamedAttributeId(this_00._M_head_impl,GENERIC);
          if (iVar10 < 0) {
            if (bVar5) {
              pcVar14 = "  Generic: Skipped";
              goto LAB_0010fe7f;
            }
          }
          else if (local_200 == 0) {
            pcVar14 = "  Generic: No quantization";
LAB_0010fe7f:
            puts(pcVar14);
          }
          else {
            printf("  Generic: Quantization = %d bits\n");
          }
          putchar(10);
          if ((mesh._M_head_impl == (Mesh *)0x0) ||
             ((int)((ulong)((long)((mesh._M_head_impl)->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)((mesh._M_head_impl)->faces_).vector_.
                                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 == 0
             )) {
            this = (ExpertEncoder *)operator_new(0xb8);
            draco::ExpertEncoder::ExpertEncoder(this,this_00._M_head_impl);
            bVar2 = false;
          }
          else {
            this = (ExpertEncoder *)operator_new(0xb8);
            bVar2 = true;
            draco::ExpertEncoder::ExpertEncoder(this,mesh._M_head_impl);
          }
          draco::Encoder::CreateExpertEncoderOptions
                    ((EncoderOptions *)local_190,(Encoder *)local_100,this_00._M_head_impl);
          draco::ExpertEncoder::Reset(this,(EncoderOptions *)local_190);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_130);
          std::
          _Rb_tree<int,_std::pair<const_int,_draco::Options>,_std::_Select1st<std::pair<const_int,_draco::Options>_>,_std::less<int>,_std::allocator<std::pair<const_int,_draco::Options>_>_>
          ::~_Rb_tree(&local_160);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_190);
          local_190._0_8_ = local_180;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"name","");
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_1d0 + 0x20),"added_edges","");
          iVar15 = draco::PointCloud::GetAttributeIdByMetadataEntry
                             (this_00._M_head_impl,(string *)local_190,(string *)(local_1d0 + 0x20))
          ;
          encoder_00 = extraout_RDX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
            encoder_00 = extraout_RDX_00;
          }
          if ((undefined1 *)local_190._0_8_ != local_180) {
            operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
            encoder_00 = extraout_RDX_01;
          }
          if ((iVar15 != -1) &&
             (draco::ExpertEncoder::SetAttributePredictionScheme(&local_58,this,iVar15,-2),
             encoder_00 = extraout_RDX_02,
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58.error_msg_._M_dataplus._M_p != &local_58.error_msg_.field_2)) {
            operator_delete(local_58.error_msg_._M_dataplus._M_p,
                            local_58.error_msg_.field_2._M_allocated_capacity + 1);
            encoder_00 = extraout_RDX_03;
          }
          if (bVar2) {
            iVar15 = anon_unknown.dwarf_8230::EncodeMeshToFile
                               ((Mesh *)local_1d0,(string *)this,encoder_00);
          }
          else {
            iVar15 = anon_unknown.dwarf_8230::EncodePointCloudToFile
                               ((PointCloud *)local_1d0,(string *)this,encoder_00);
          }
          if ((iVar15 != -1) && ((int)local_1f8 < 10)) {
            puts("For better compression, increase the compression level up to \'-cl 10\' .\n");
          }
          (*(this->super_EncoderBase<draco::EncoderOptionsBase<int>_>)._vptr_EncoderBase[1])(this);
          draco::EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::
          ~EncoderBase((EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *)
                       local_100);
          mesh._M_head_impl = (Mesh *)this_00._M_head_impl;
        }
      }
    }
    else {
      local_e8._M_allocated_capacity = (size_type)(local_100 + 8);
      local_100._8_4_ = _S_red;
      local_f0 = (_Base_ptr)0x0;
      local_d8._M_head_impl = (PointCloud *)0x0;
      local_190._0_8_ = local_180;
      local_e8._8_8_ = local_e8._M_allocated_capacity;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"use_metadata","");
      draco::Options::SetBool((Options *)local_100,(string *)local_190,bStack_1f3);
      if ((undefined1 *)local_190._0_8_ != local_180) {
        operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
      }
      local_190._0_8_ = local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"preserve_polygons","");
      draco::Options::SetBool((Options *)local_100,(string *)local_190,local_1f4);
      if ((undefined1 *)local_190._0_8_ != local_180) {
        operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
      }
      draco::ReadMeshFromFile
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 local_190,&local_1f0,(Options *)local_100);
      uVar8 = local_190._0_4_;
      if (local_190._0_4_ == OK) {
        iVar15 = 0;
        mesh._M_head_impl = local_168._M_head_impl;
      }
      else {
        printf("Failed loading the input mesh: %s.\n");
        iVar15 = -1;
        mesh._M_head_impl = (Mesh *)0x0;
        if ((__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)local_168._M_head_impl
            != (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
          mesh._M_head_impl = (Mesh *)0x0;
        }
      }
      local_168._M_head_impl = (Mesh *)0x0;
      if ((undefined1 *)local_190._8_8_ != local_180 + 8) {
        operator_delete((void *)local_190._8_8_,local_180._8_8_ + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_100);
      this_00._M_head_impl = &(mesh._M_head_impl)->super_PointCloud;
      if (uVar8 == OK) goto LAB_0010fb3d;
    }
    if (mesh._M_head_impl != (Mesh *)0x0) {
      (*((mesh._M_head_impl)->super_PointCloud)._vptr_PointCloud[1])(mesh._M_head_impl);
    }
    goto LAB_0010f92b;
  }
LAB_0010f921:
  anon_unknown.dwarf_8230::Usage();
  iVar15 = -1;
LAB_0010f92b:
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  return iVar15;
}

Assistant:

int main(int argc, char **argv) {
  Options options;
  const int argc_check = argc - 1;

  for (int i = 1; i < argc; ++i) {
    if (!strcmp("-h", argv[i]) || !strcmp("-?", argv[i])) {
      Usage();
      return 0;
    } else if (!strcmp("-i", argv[i]) && i < argc_check) {
      options.input = argv[++i];
    } else if (!strcmp("-o", argv[i]) && i < argc_check) {
      options.output = argv[++i];
    } else if (!strcmp("-point_cloud", argv[i])) {
      options.is_point_cloud = true;
    } else if (!strcmp("-qp", argv[i]) && i < argc_check) {
      options.pos_quantization_bits = StringToInt(argv[++i]);
      if (options.pos_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the position "
            "attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qt", argv[i]) && i < argc_check) {
      options.tex_coords_quantization_bits = StringToInt(argv[++i]);
      if (options.tex_coords_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the texture "
            "coordinate attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qn", argv[i]) && i < argc_check) {
      options.normals_quantization_bits = StringToInt(argv[++i]);
      if (options.normals_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the normal "
            "attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qg", argv[i]) && i < argc_check) {
      options.generic_quantization_bits = StringToInt(argv[++i]);
      if (options.generic_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for generic "
            "attributes is 30.\n");
        return -1;
      }
    } else if (!strcmp("-cl", argv[i]) && i < argc_check) {
      options.compression_level = StringToInt(argv[++i]);
    } else if (!strcmp("--skip", argv[i]) && i < argc_check) {
      if (!strcmp("NORMAL", argv[i + 1])) {
        options.normals_quantization_bits = -1;
      } else if (!strcmp("TEX_COORD", argv[i + 1])) {
        options.tex_coords_quantization_bits = -1;
      } else if (!strcmp("GENERIC", argv[i + 1])) {
        options.generic_quantization_bits = -1;
      } else {
        printf("Error: Invalid attribute name after --skip\n");
        return -1;
      }
      ++i;
    } else if (!strcmp("--metadata", argv[i])) {
      options.use_metadata = true;
    } else if (!strcmp("-preserve_polygons", argv[i])) {
      options.preserve_polygons = true;
    }
  }
  if (argc < 3 || options.input.empty()) {
    Usage();
    return -1;
  }

  std::unique_ptr<draco::PointCloud> pc;
  draco::Mesh *mesh = nullptr;
  if (!options.is_point_cloud) {
    draco::Options load_options;
    load_options.SetBool("use_metadata", options.use_metadata);
    load_options.SetBool("preserve_polygons", options.preserve_polygons);
    auto maybe_mesh = draco::ReadMeshFromFile(options.input, load_options);
    if (!maybe_mesh.ok()) {
      printf("Failed loading the input mesh: %s.\n",
             maybe_mesh.status().error_msg());
      return -1;
    }
    mesh = maybe_mesh.value().get();
    pc = std::move(maybe_mesh).value();
  } else {
    auto maybe_pc = draco::ReadPointCloudFromFile(options.input);
    if (!maybe_pc.ok()) {
      printf("Failed loading the input point cloud: %s.\n",
             maybe_pc.status().error_msg());
      return -1;
    }
    pc = std::move(maybe_pc).value();
  }

  if (options.pos_quantization_bits < 0) {
    printf("Error: Position attribute cannot be skipped.\n");
    return -1;
  }

  // Delete attributes if needed. This needs to happen before we set any
  // quantization settings.
  if (options.tex_coords_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::TEX_COORD) > 0) {
      options.tex_coords_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::TEX_COORD) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::TEX_COORD, 0));
    }
  }
  if (options.normals_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::NORMAL) > 0) {
      options.normals_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::NORMAL) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::NORMAL, 0));
    }
  }
  if (options.generic_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::GENERIC) > 0) {
      options.generic_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::GENERIC) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::GENERIC, 0));
    }
  }
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  // If any attribute has been deleted, run deduplication of point indices again
  // as some points can be possibly combined.
  if (options.tex_coords_deleted || options.normals_deleted ||
      options.generic_deleted) {
    pc->DeduplicatePointIds();
  }
#endif

  // Convert compression level to speed (that 0 = slowest, 10 = fastest).
  const int speed = 10 - options.compression_level;

  draco::Encoder encoder;

  // Setup encoder options.
  if (options.pos_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::POSITION,
                                     options.pos_quantization_bits);
  }
  if (options.tex_coords_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::TEX_COORD,
                                     options.tex_coords_quantization_bits);
  }
  if (options.normals_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::NORMAL,
                                     options.normals_quantization_bits);
  }
  if (options.generic_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::GENERIC,
                                     options.generic_quantization_bits);
  }
  encoder.SetSpeedOptions(speed, speed);

  if (options.output.empty()) {
    // Create a default output file by attaching .drc to the input file name.
    options.output = options.input + ".drc";
  }

  PrintOptions(*pc, options);

  const bool input_is_mesh = mesh && mesh->num_faces() > 0;

  // Convert to ExpertEncoder that allows us to set per-attribute options.
  std::unique_ptr<draco::ExpertEncoder> expert_encoder;
  if (input_is_mesh) {
    expert_encoder.reset(new draco::ExpertEncoder(*mesh));
  } else {
    expert_encoder.reset(new draco::ExpertEncoder(*pc));
  }
  expert_encoder->Reset(encoder.CreateExpertEncoderOptions(*pc));

  // Check if there is an attribute that stores polygon edges. If so, we disable
  // the default prediction scheme for the attribute as it actually makes the
  // compression worse.
  const int poly_att_id =
      pc->GetAttributeIdByMetadataEntry("name", "added_edges");
  if (poly_att_id != -1) {
    expert_encoder->SetAttributePredictionScheme(
        poly_att_id, draco::PredictionSchemeMethod::PREDICTION_NONE);
  }

  int ret = -1;

  if (input_is_mesh) {
    ret = EncodeMeshToFile(*mesh, options.output, expert_encoder.get());
  } else {
    ret = EncodePointCloudToFile(*pc, options.output, expert_encoder.get());
  }

  if (ret != -1 && options.compression_level < 10) {
    printf(
        "For better compression, increase the compression level up to '-cl 10' "
        ".\n\n");
  }

  return ret;
}